

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

char * mpt_encoding_type(int type)

{
  int local_18;
  int i;
  int type_local;
  
  local_18 = 0;
  while( true ) {
    if (7 < local_18) {
      return (char *)0x0;
    }
    if ((uint)_encodings[local_18].id == type) break;
    local_18 = local_18 + 1;
  }
  return _encodings[local_18].name;
}

Assistant:

extern const char *mpt_encoding_type(int type)
{
	static const int max = sizeof(_encodings)/sizeof(*_encodings);
	int i;
	
	for (i = 0; i < max; ++i) {
		if (((int) _encodings[i].id) == type) {
			return _encodings[i].name;
		}
	}
	return 0;
}